

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O1

Abc_Cex_t * Abc_CexMakeTriv(int nRegs,int nTruePis,int nTruePos,int iFrameOut)

{
  size_t __size;
  Abc_Cex_t *__s;
  uint uVar1;
  
  if (0 < nRegs) {
    uVar1 = (iFrameOut / nTruePos + 1) * nTruePis + nRegs;
    __size = (long)(int)((((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0)) * 4 + 0x14;
    __s = (Abc_Cex_t *)malloc(__size);
    memset(__s,0,__size);
    __s->nRegs = nRegs;
    __s->nPis = nTruePis;
    __s->nBits = uVar1;
    __s->iPo = iFrameOut % nTruePos;
    __s->iFrame = iFrameOut / nTruePos;
    return __s;
  }
  __assert_fail("nRegs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                ,0x59,"Abc_Cex_t *Abc_CexMakeTriv(int, int, int, int)");
}

Assistant:

Abc_Cex_t * Abc_CexMakeTriv( int nRegs, int nTruePis, int nTruePos, int iFrameOut )
{
    Abc_Cex_t * pCex;
    int iPo, iFrame;
    assert( nRegs > 0 );
    iPo    = iFrameOut % nTruePos;
    iFrame = iFrameOut / nTruePos;
    // allocate the counter example
    pCex = Abc_CexAlloc( nRegs, nTruePis, iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;
    return pCex;
}